

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall Fad<double>::operator/=(Fad<double> *this,double *val)

{
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->val_ = this->val_ / *val;
  uVar1 = (this->dx_).num_elts;
  if (uVar1 != 0) {
    pdVar2 = (this->dx_).ptr_to_data;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pdVar2[uVar4] = pdVar2[uVar4] / *val;
    }
  }
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator/= (const T& val)
{
  val_ /= val;

  int sz = dx_.size();
  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    for (int i=0; i<sz;++i)
      dxp[i] /= val;
  }

  return *this;
}